

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_io.cpp
# Opt level: O3

adios2_error adios2_engine_type(char *engine_type,size_t *size,adios2_io *io)

{
  ulong uVar1;
  string local_60;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"for const adios2_io, in call to adios2_io_engine_type","");
  adios2::helper::CheckForNullptr<adios2_io_const>(io,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"for size_t* size, in call to adios2_io_engine_type","");
  adios2::helper::CheckForNullptr<unsigned_long>(size,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  uVar1 = *(ulong *)(io + 0xb0);
  *size = uVar1;
  if (engine_type != (char *)0x0) {
    std::__cxx11::string::copy((char *)(io + 0xa8),(ulong)engine_type,uVar1);
  }
  return adios2_error_none;
}

Assistant:

adios2_error adios2_engine_type(char *engine_type, size_t *size, const adios2_io *io)
{
    try
    {
        adios2::helper::CheckForNullptr(io,
                                        "for const adios2_io, in call to adios2_io_engine_type");
        adios2::helper::CheckForNullptr(size, "for size_t* size, in call to adios2_io_engine_type");

        const adios2::core::IO *ioCpp = reinterpret_cast<const adios2::core::IO *>(io);

        return String2CAPI(ioCpp->m_EngineType, engine_type, size);
    }
    catch (...)
    {
        return static_cast<adios2_error>(adios2::helper::ExceptionToError("adios2_engine_type"));
    }
}